

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextOptimizationOverrideInfo.cpp
# Opt level: O2

void __thiscall
Js::ScriptContextOptimizationOverrideInfo::Merge
          (ScriptContextOptimizationOverrideInfo *this,ScriptContextOptimizationOverrideInfo *info)

{
  SideEffects SVar1;
  ScriptContextOptimizationOverrideInfo *pSVar2;
  INT_PTR IVar3;
  code *pcVar4;
  INT_PTR IVar5;
  INT_PTR IVar6;
  bool bVar7;
  undefined4 *puVar8;
  ScriptContextOptimizationOverrideInfo *pSVar9;
  ScriptContextOptimizationOverrideInfo *pSVar10;
  ScriptContextOptimizationOverrideInfo *pSVar11;
  ScriptContextOptimizationOverrideInfo *this_00;
  
  pSVar10 = this->crossSiteRoot;
  pSVar2 = info->crossSiteRoot;
  pSVar11 = info;
  if (pSVar10 == pSVar2) {
    if (pSVar10 != (ScriptContextOptimizationOverrideInfo *)0x0) {
      return;
    }
    Update(this,info);
    this->crossSiteRoot = this;
    this->crossSitePrev = this;
    this->crossSiteNext = this;
    this_00 = this;
  }
  else {
    this_00 = pSVar10;
    if (pSVar10 == (ScriptContextOptimizationOverrideInfo *)0x0) {
      pSVar11 = this;
      this_00 = pSVar2;
    }
    Update(this_00,pSVar11);
    if (this_00->crossSiteRoot == (ScriptContextOptimizationOverrideInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextOptimizationOverrideInfo.cpp"
                                  ,0x2b,"(crossSiteRoot != nullptr)","crossSiteRoot != nullptr");
      if (!bVar7) goto LAB_007091f4;
      *puVar8 = 0;
    }
    IVar5 = this_00->arraySetElementFastPathVtable;
    IVar6 = this_00->intArraySetElementFastPathVtable;
    IVar3 = this_00->floatArraySetElementFastPathVtable;
    SVar1 = this_00->sideEffects;
    pSVar9 = this_00;
    do {
      pSVar9->arraySetElementFastPathVtable = IVar5;
      pSVar9->intArraySetElementFastPathVtable = IVar6;
      pSVar9->floatArraySetElementFastPathVtable = IVar3;
      pSVar9->sideEffects = SVar1;
      pSVar9 = pSVar9->crossSiteNext;
    } while (pSVar9 != this_00);
    if (pSVar10 != (ScriptContextOptimizationOverrideInfo *)0x0 &&
        pSVar2 != (ScriptContextOptimizationOverrideInfo *)0x0) {
      pSVar10 = pSVar11;
      if (info->crossSiteRoot == (ScriptContextOptimizationOverrideInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextOptimizationOverrideInfo.cpp"
                                    ,0x39,"(crossSiteRoot != nullptr)","crossSiteRoot != nullptr");
        if (!bVar7) {
LAB_007091f4:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar8 = 0;
      }
      do {
        pSVar2 = pSVar10->crossSiteNext;
        Insert(this_00,pSVar10);
        pSVar10 = pSVar2;
      } while (pSVar2 != pSVar11);
      goto LAB_007091dd;
    }
  }
  Insert(this_00,pSVar11);
LAB_007091dd:
  Verify(this);
  return;
}

Assistant:

void
ScriptContextOptimizationOverrideInfo::Merge(ScriptContextOptimizationOverrideInfo * info)
{
    ScriptContextOptimizationOverrideInfo * thisRoot = this->crossSiteRoot;
    ScriptContextOptimizationOverrideInfo * infoRoot = info->crossSiteRoot;
    if (thisRoot == infoRoot)
    {
        if (thisRoot != nullptr)
        {
            // Both info is already in the same info group
            return;
        }

        // Both of them are null, just group them

        // Update this to be the template
        this->Update(info);

        // Initialize the cross site list
        this->crossSiteRoot = this;
        this->crossSitePrev = this;
        this->crossSiteNext = this;

        // Insert the info to the list
        this->Insert(info);
    }
    else
    {
        if (thisRoot == nullptr)
        {
            thisRoot = infoRoot;
            infoRoot = nullptr;
            info = this;
        }

        thisRoot->Update(info);

        // Spread the information on the current group
        thisRoot->ForEachCrossSiteInfo([thisRoot](ScriptContextOptimizationOverrideInfo * i)
        {
            thisRoot->CopyTo(i);
        });

        if (infoRoot == nullptr)
        {
            thisRoot->Insert(info);
        }
        else
        {
            // Insert the other group
            info->ForEachEditingCrossSiteInfo([thisRoot](ScriptContextOptimizationOverrideInfo * i)
            {
                thisRoot->Insert(i);
            });
        }
    }

    DebugOnly(Verify());
}